

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O3

void __thiscall
TasgridWrapper::writeMatrix(TasgridWrapper *this,string *filename,int rows,int cols,double *mat)

{
  ostream *poVar1;
  double *pdVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  char tsg [3];
  ofstream ofs;
  int local_258;
  int local_254;
  double *local_250;
  undefined2 local_244;
  undefined1 local_242;
  long local_240;
  ulong local_238;
  long local_230;
  filebuf local_228 [8];
  undefined8 uStack_220;
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  if (filename->_M_string_length != 0) {
    local_258 = cols;
    local_254 = rows;
    local_250 = mat;
    std::ofstream::ofstream(&local_230);
    if (this->useASCII == true) {
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
      poVar1 = (ostream *)std::ostream::operator<<(&local_230,rows);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,cols);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x11;
      *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
           *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
      if (0 < rows) {
        lVar5 = (long)cols;
        local_238 = (ulong)(uint)rows;
        local_240 = lVar5 * 8;
        uVar3 = 0;
        pdVar2 = local_250;
        do {
          *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 0x19;
          std::ostream::_M_insert<double>(local_250[uVar3 * lVar5]);
          if (1 < (uint)cols) {
            lVar4 = 1;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
              *(undefined8 *)((long)&uStack_220 + *(long *)(local_230 + -0x18)) = 0x19;
              std::ostream::_M_insert<double>(pdVar2[lVar4]);
              lVar4 = lVar4 + 1;
            } while (lVar5 != lVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
          uVar3 = uVar3 + 1;
          pdVar2 = (double *)((long)pdVar2 + local_240);
        } while (uVar3 < local_238);
      }
    }
    else {
      std::ofstream::open((string *)&local_230,(_Ios_Openmode)filename);
      local_242 = 0x47;
      local_244 = 0x5354;
      std::ostream::write((char *)&local_230,(long)&local_244);
      std::ostream::write((char *)&local_230,(long)&local_254);
      std::ostream::write((char *)&local_230,(long)&local_258);
      std::ostream::write((char *)&local_230,(long)local_250);
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _getGPUName_abi_cxx11_;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void TasgridWrapper::writeMatrix(std::string const &filename, int rows, int cols, const double mat[]) const{
    if (filename.empty()) return;
    size_t cols_t = (size_t) cols;
    std::ofstream ofs;
    if (useASCII){
        Utils::Wrapper2D<const double> matrix(cols, mat);
        ofs.open(filename);
        ofs << rows << " " << cols << "\n";
        ofs.precision(17);
        ofs << std::scientific;
        for(int i=0; i<rows; i++){
            double const * r = matrix.getStrip(i);
            ofs << setw(25) << r[0];
            for(size_t j=1; j<cols_t; j++){
                ofs << " " << setw(25) << r[j];
            }
            ofs << "\n";
        }
    }else{
        ofs.open(filename, std::ios::out | std::ios::binary);
        char tsg[3] = {'T', 'S', 'G'};
        ofs.write(tsg, 3*sizeof(char));
        ofs.write((char*) &rows, sizeof(int));
        ofs.write((char*) &cols, sizeof(int));
        ofs.write((char*) mat, Utils::size_mult(rows, cols) * sizeof(double));
    }
    ofs.close();
}